

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE.h
# Opt level: O3

Permutazione * __thiscall
ADE<Permutazione>::esegui
          (Permutazione *__return_storage_ptr__,ADE<Permutazione> *this,unsigned_short nIndividui,
          unsigned_long_long tempoDisponibileMs,double theta,double Fmin,double Fmax,
          bool normalizzazione,uint s)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  IndiciRandom *pIVar10;
  short sVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  Permutazione *this_00;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  unsigned_short treIndici [3];
  uniform_int_distribution<int> local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  ushort local_7e;
  ushort local_7c;
  Permutazione *local_78;
  ulong local_70;
  double local_68;
  long local_60;
  ADE<Permutazione> *local_58;
  double local_50;
  ulong local_48;
  undefined8 *local_40;
  double local_38;
  
  uVar12 = (ulong)s;
  local_68 = theta;
  local_50 = Fmax;
  local_60 = std::chrono::_V2::system_clock::now();
  this->seed = s;
  if (s != 0) {
    lVar14 = 1;
    genRand.gen._M_x[0] = uVar12;
    do {
      uVar12 = (ulong)(((uint)(uVar12 >> 0x1e) ^ (uint)uVar12) * 0x6c078965 + (int)lVar14);
      genRand.gen._M_x[lVar14] = uVar12;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x270);
    genRand.gen._M_p = 0x270;
  }
  uVar12 = (ulong)nIndividui;
  uVar13 = (ulong)((uint)nIndividui * 8);
  local_78 = __return_storage_ptr__;
  puVar8 = (undefined8 *)operator_new__(uVar13);
  puVar9 = (undefined8 *)operator_new__((ulong)((uint)nIndividui * 8 + 8));
  (**this->_vptr_ADE)(this,puVar8,uVar12);
  (**this->_vptr_ADE)(this,puVar9,(ulong)(nIndividui + 1 & 0xffff));
  local_90 = operator_new__(uVar13);
  local_88 = operator_new__(uVar13);
  local_a8 = operator_new__(uVar12);
  local_98 = operator_new__(uVar13);
  local_a0 = operator_new__(uVar13);
  (*this->_vptr_ADE[1])(this,puVar8,uVar12);
  pIVar10 = (IndiciRandom *)operator_new(0x18);
  IndiciRandom::IndiciRandom(pIVar10,&genRand,nIndividui);
  this->indiciRandom = pIVar10;
  if (nIndividui != 0) {
    uVar13 = 0;
    do {
      *(undefined8 *)((long)local_98 + uVar13 * 8) = 0x3fe0000000000000;
      *(undefined8 *)((long)local_a0 + uVar13 * 8) = 0x3fe0000000000000;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  local_60 = local_60 + tempoDisponibileMs * 1000000;
  std::chrono::_V2::system_clock::now();
  local_40 = puVar8 + uVar12;
  lVar14 = 0x3f;
  if (nIndividui != 0) {
    for (; nIndividui >> lVar14 == 0; lVar14 = lVar14 + -1) {
    }
  }
  local_48 = (ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e;
  iVar16 = nIndividui - 1;
  local_70 = 0;
  local_58 = this;
  do {
    puVar5 = local_40;
    if (nIndividui != 0) {
      std::
      __introsort_loop<Permutazione**,long,__gnu_cxx::__ops::_Iter_comp_iter<ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>>
                (puVar8,local_40,local_48);
      std::
      __final_insertion_sort<Permutazione**,__gnu_cxx::__ops::_Iter_comp_iter<ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>>
                (puVar8,puVar5);
    }
    lVar14 = std::chrono::_V2::system_clock::now();
    dVar19 = (double)(local_60 - lVar14) / 1000000000.0;
    if (dVar19 <= 0.0) break;
    local_38 = dVar19;
    if (nIndividui == 0) {
LAB_0010786d:
      (*this->_vptr_ADE[6])(this,*puVar9);
      (*this->_vptr_ADE[4])
                (local_68,this,puVar8,puVar9,uVar12,(ulong)(uint)normalizzazione,local_a8);
    }
    else {
      uVar13 = 0;
      do {
        local_b0._M_param._M_a = 0;
        local_b0._M_param._M_b = iVar16;
        uVar7 = std::uniform_int_distribution<int>::operator()
                          (&local_b0,&genRand.gen,&local_b0._M_param);
        dVar19 = *(double *)((long)local_98 + (ulong)(uVar7 & 0xffff) * 8);
        do {
          do {
            dVar18 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&genRand.gen);
          } while (dVar18 == 0.5);
          dVar18 = tan(dVar18 * 3.141592653589793);
          dVar18 = dVar18 * 0.1 + dVar19;
        } while (dVar18 < 0.0);
        if (local_50 <= dVar18) {
          dVar18 = local_50;
        }
        *(double *)((long)local_90 + uVar13 * 8) = dVar18;
        local_b0._M_param._M_a = 0;
        local_b0._M_param._M_b = iVar16;
        uVar7 = std::uniform_int_distribution<int>::operator()
                          (&local_b0,&genRand.gen,&local_b0._M_param);
        dVar19 = *(double *)((long)local_a0 + (ulong)(uVar7 & 0xffff) * 8);
        do {
          do {
            dVar18 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&genRand.gen);
          } while (dVar18 == 0.5);
          dVar18 = tan(dVar18 * 3.141592653589793);
          pvVar4 = local_88;
          pvVar3 = local_90;
          dVar18 = dVar18 * 0.1 + dVar19;
        } while (dVar18 < 0.0);
        if (local_50 <= dVar18) {
          dVar18 = local_50;
        }
        *(double *)((long)local_88 + uVar13 * 8) = dVar18;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
      if (nIndividui == 0) goto LAB_0010786d;
      uVar13 = 0;
      do {
        IndiciRandom::generaIndici(local_58->indiciRandom,&local_7e,3);
        (**(code **)(*(long *)puVar9[uVar13] + 0x10))((long *)puVar9[uVar13],puVar8[local_7e]);
        Permutazione::differenza((Permutazione *)puVar9[uVar13],(Permutazione *)puVar8[local_7c]);
        (**(code **)(*(long *)puVar9[uVar13] + 0x18))(*(undefined8 *)((long)pvVar4 + uVar13 * 8));
        (**(code **)(*(long *)puVar9[uVar13 + 1] + 0x10))((long *)puVar9[uVar13 + 1],*puVar8);
        Permutazione::differenza((Permutazione *)puVar9[uVar13 + 1],(Permutazione *)puVar8[uVar13]);
        (**(code **)(*(long *)puVar9[uVar13 + 1] + 0x18))
                  (*(undefined8 *)((long)pvVar3 + uVar13 * 8));
        Permutazione::somma((Permutazione *)puVar9[uVar13],(Permutazione *)puVar9[uVar13 + 1]);
        Permutazione::somma((Permutazione *)puVar9[uVar13],(Permutazione *)puVar8[uVar13]);
        this = local_58;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      (*local_58->_vptr_ADE[6])(local_58,*puVar9);
      (*this->_vptr_ADE[4])
                (local_68,this,puVar8,puVar9,uVar12,(ulong)(uint)normalizzazione,local_a8);
      if (nIndividui != 0) {
        dVar19 = 0.0;
        uVar13 = 0;
        sVar11 = 0;
        dVar18 = 0.0;
        dVar21 = 0.0;
        dVar20 = 0.0;
        do {
          if (*(char *)((long)local_a8 + uVar13) == '\x01') {
            dVar1 = *(double *)((long)local_90 + uVar13 * 8);
            dVar21 = dVar21 + dVar1;
            dVar20 = dVar20 + dVar1 * dVar1;
            dVar1 = *(double *)((long)local_88 + uVar13 * 8);
            dVar19 = dVar19 + dVar1;
            dVar18 = dVar18 + dVar1 * dVar1;
            sVar11 = sVar11 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        if (sVar11 != 0) {
          *(double *)((long)local_98 + (ulong)((uint)(ushort)local_70 * 8)) = dVar20 / dVar21;
          *(double *)((long)local_a0 + (ulong)((uint)(ushort)local_70 * 8)) = dVar18 / dVar19;
          local_70 = (ulong)((ushort)local_70 + 1) % uVar12;
        }
      }
    }
  } while (0.0 < local_38);
  this_00 = local_78;
  if (nIndividui == 0) {
    (*this->_vptr_ADE[6])(this,*puVar8);
    this_00 = local_78;
    Permutazione::Permutazione(local_78,(Permutazione *)*puVar8);
  }
  else {
    uVar7 = 0xffffffff;
    uVar13 = 0;
    uVar15 = 0;
    do {
      uVar2 = *(uint *)(puVar8[uVar13] + 0x14);
      bVar17 = uVar2 < uVar7;
      if (bVar17) {
        uVar7 = uVar2;
      }
      uVar6 = uVar13 & 0xffffffff;
      if (!bVar17) {
        uVar6 = uVar15;
      }
      uVar15 = uVar6;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    (*this->_vptr_ADE[6])(this,puVar8[uVar15 & 0xffff]);
    Permutazione::Permutazione(this_00,(Permutazione *)puVar8[uVar15 & 0xffff]);
    if (nIndividui != 0) {
      uVar13 = 0;
      do {
        if ((long *)puVar8[uVar13] != (long *)0x0) {
          (**(code **)(*(long *)puVar8[uVar13] + 8))();
        }
        if ((long *)puVar9[uVar13] != (long *)0x0) {
          (**(code **)(*(long *)puVar9[uVar13] + 8))();
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
  }
  if ((long *)puVar9[uVar12] != (long *)0x0) {
    (**(code **)(*(long *)puVar9[uVar12] + 8))();
  }
  operator_delete__(puVar8);
  operator_delete__(puVar9);
  operator_delete__(local_90);
  operator_delete__(local_88);
  operator_delete__(local_98);
  operator_delete__(local_a0);
  operator_delete__(local_a8);
  pIVar10 = this->indiciRandom;
  if (pIVar10 != (IndiciRandom *)0x0) {
    IndiciRandom::~IndiciRandom(pIVar10);
  }
  operator_delete(pIVar10,0x18);
  return this_00;
}

Assistant:

T esegui(unsigned short nIndividui, unsigned long long tempoDisponibileMs, double theta, double Fmin, 
			double Fmax, bool normalizzazione, unsigned int s) {

			using orologio = std::chrono::system_clock;
			auto tempoFinale = orologio::now() + chrono::milliseconds(tempoDisponibileMs);
			using sec = std::chrono::duration<double>;

			seed = s;
			if(seed > 0) genRand.impostaSeed(seed);

			T** popolazione = new T * [nIndividui];
			T** popolazioneAlternativa = new T * [nIndividui + 1];

			creaPopolazione(popolazione, nIndividui);

			//L'ultimo elemento � di appoggio
			creaPopolazione(popolazioneAlternativa, nIndividui + 1);

			double* vettoreF1 = new double[nIndividui];
			double* vettoreF2 = new double[nIndividui];

			bool* vettoreSuccessi = new bool[nIndividui];

			unsigned short h = nIndividui;
			double* vettoreM1 = new double[h];
			double* vettoreM2 = new double[h];

			inizializzaPopolazione(popolazione, nIndividui, normalizzazione);

			//stampa(popolazione, nIndividui);

			indiciRandom = new IndiciRandom(&genRand, nIndividui);

			for (unsigned short i = 0; i < h; i++) {
				vettoreM1[i] = 0.5;
				vettoreM2[i] = 0.5;
			}

			unsigned short treIndici[3];

			unsigned int contatore = 0;
			sec tempoDisponibile = tempoFinale - orologio::now();

			unsigned short posizione = 0;


			while (true) {

				sort(popolazione, popolazione + nIndividui, [](T* p1, T* p2) -> bool {
					return p1->score < p2->score;
				});

				sec tempoRimasto = tempoFinale - orologio::now();
				auto count = tempoRimasto.count();
				if (count <= 0.)
					break;

				//cout << "Tempo rimasto: " << (unsigned int)count << " secondi \t\r";
				//stampa(popolazione, nIndividui);

				unsigned short indiceRandom;
				double valoreRandom;

				for (unsigned short i = 0; i < nIndividui; i++) {

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM1[indiceRandom], 0.1);
					} while (valoreRandom < 0);

					vettoreF1[i] = min(Fmax, valoreRandom);

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM2[indiceRandom], 0.1);
					} while (valoreRandom < 0);
	
					vettoreF2[i] = min(Fmax, valoreRandom);
				}

				for (unsigned short i = 0; i < nIndividui; i++) {
					indiciRandom->generaIndici(treIndici, 3);

					*popolazioneAlternativa[i] = *(popolazione[treIndici[0]]);
					popolazioneAlternativa[i]->differenza(popolazione[treIndici[1]]);
					popolazioneAlternativa[i]->prodotto(vettoreF2[i]);

					*popolazioneAlternativa[i + 1] = *(popolazione[0]);
					popolazioneAlternativa[i + 1]->differenza(popolazione[i]);
					popolazioneAlternativa[i + 1]->prodotto(vettoreF1[i]);

					popolazioneAlternativa[i]->somma(popolazioneAlternativa[i + 1]);
					popolazioneAlternativa[i]->somma(popolazione[i]);
				}

				ricercaLocale(popolazioneAlternativa[0]);

				selezionaPopolazione(popolazione, popolazioneAlternativa, nIndividui, theta, normalizzazione, vettoreSuccessi);

				double sQ1 = 0, s1 = 0, sQ2 = 0, s2 = 0;

				unsigned short contatore = 0;
				for (unsigned short i = 0; i < nIndividui; i++) {
					if (vettoreSuccessi[i]) {
						sQ1 += pow(vettoreF1[i], 2);
						s1 += vettoreF1[i];
						sQ2 += pow(vettoreF2[i], 2);
						s2 += vettoreF2[i];
						contatore++;
					}
				}

				if (contatore != 0) {
					double mediaP = sQ1 / s1;
					vettoreM1[posizione] = mediaP;

					mediaP = sQ2 / s2;
					vettoreM2[posizione] = mediaP;

					posizione = (posizione + 1) % h;
				}
				
			}

			//cout << endl << endl;

			//Troviamo l'individuo migliore
			unsigned int migliorPunteggioIniziale = UINT32_MAX;
			unsigned short migliore = 0;

			for (unsigned short i = 0; i < nIndividui; i++) {
				if (popolazione[i]->score < migliorPunteggioIniziale) {
					migliorPunteggioIniziale = popolazione[i]->score;
					migliore = i;
				}
			}

			ricercaLocale(popolazione[migliore]);

			//stampa(popolazione, nIndividui);

			T migliorIndividuo = *(popolazione[migliore]);

			for (unsigned int i = 0; i < nIndividui; i++) {
				delete popolazione[i];
				delete popolazioneAlternativa[i];
			}
			delete popolazioneAlternativa[nIndividui];

			delete[] popolazione;
			delete[] popolazioneAlternativa;

			delete[] vettoreF1;
			delete[] vettoreF2;
			delete[] vettoreM1;
			delete[] vettoreM2;
			delete[] vettoreSuccessi;

			delete indiciRandom;

			return migliorIndividuo;
		}